

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PxVector.h
# Opt level: O3

void __thiscall
hacd::vector<HACD::HACD_API::Hull>::recreate(vector<HACD::HACD_API::Hull> *this,HaU32 capacity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Hull *pHVar3;
  uint uVar4;
  undefined8 uVar5;
  Hull *pHVar6;
  long lVar7;
  Hull *__src;
  
  if (capacity == 0) {
    __src = this->mData;
    if (this->mSize == 0) {
      pHVar6 = (Hull *)0x0;
    }
    else {
      pHVar6 = (Hull *)0x0;
      memcpy((void *)0x0,__src,(((ulong)this->mSize * 0x18 - 1) / 0x18) * 0x18 + 0x18);
    }
  }
  else {
    pHVar6 = (Hull *)malloc((ulong)capacity * 0x18);
    if ((pHVar6 == (Hull *)0x0) || (__src = this->mData, pHVar6 == __src)) {
      __assert_fail("!capacity || newData && newData != mData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                    ,0x23b,
                    "void hacd::vector<HACD::HACD_API::Hull>::recreate(HaU32) [T = HACD::HACD_API::Hull]"
                   );
    }
    uVar4 = this->mSize;
    if ((ulong)uVar4 != 0) {
      lVar7 = 0;
      do {
        *(undefined8 *)((long)&pHVar6->mIndices + lVar7) =
             *(undefined8 *)((long)&__src->mIndices + lVar7);
        pHVar3 = (Hull *)((long)&pHVar6[1].mTriangleCount + lVar7);
        puVar1 = (undefined8 *)((long)&__src->mTriangleCount + lVar7);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pHVar6->mTriangleCount + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar7 = lVar7 + 0x18;
      } while (pHVar3 < pHVar6 + uVar4);
    }
  }
  if (-1 < (int)this->mCapacity) {
    free(__src);
  }
  this->mData = pHVar6;
  this->mCapacity = capacity;
  return;
}

Assistant:

HACD_NOINLINE void vector<T>::recreate(HaU32 capacity)
	{
		T* newData = allocate(capacity);
		HACD_ASSERT(!capacity || newData && newData != mData);

		copy(newData, newData + mSize, mData);
		destroy(mData, mData + mSize);
		if(!isInUserMemory())
			deallocate(mData);

		mData = newData;
		mCapacity = capacity;
	}